

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRMultipartHeaderFromFile
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,char *filename,
              char **err)

{
  undefined4 in_EAX;
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_type __n;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator_type local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  size_type local_38;
  
  auVar4._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar4._4_4_ = -(uint)(num_headers == (int *)0x0);
  auVar4._8_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  auVar4._12_4_ = -(uint)(filename == (char *)0x0);
  iVar1 = movmskps(in_EAX,auVar4);
  if (iVar1 == 0) {
    __stream = fopen(filename,"rb");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_50,__n,&local_51);
      local_38 = fread(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,1,__n,__stream);
      fclose(__stream);
      if (local_38 == __n) {
        if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar3 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,0,0);
          if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (uchar *)0x0) {
            operator_delete(local_50.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_50.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_50.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          _Unwind_Resume(uVar3);
        }
        iVar1 = ParseEXRMultipartHeaderFromMemory
                          (exr_headers,num_headers,exr_version,
                           local_50.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,err);
      }
      else {
        iVar1 = -5;
        if (err != (char **)0x0) {
          *err = "fread error.";
        }
      }
      if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (uchar *)0x0) {
        return iVar1;
      }
      operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      return iVar1;
    }
    iVar1 = -6;
    if (err == (char **)0x0) {
      return -6;
    }
    pcVar2 = "Cannot read file.";
  }
  else {
    iVar1 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar2 = "Invalid argument.";
  }
  *err = pcVar2;
  return iVar1;
}

Assistant:

int ParseEXRMultipartHeaderFromFile(EXRHeader ***exr_headers, int *num_headers,
                                    const EXRVersion *exr_version,
                                    const char *filename, const char **err) {
  if (exr_headers == NULL || num_headers == NULL || exr_version == NULL ||
      filename == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);

    if (ret != filesize) {
      if (err) {
        (*err) = "fread error.";
      }
      return TINYEXR_ERROR_INVALID_FILE;
    }
  }

  return ParseEXRMultipartHeaderFromMemory(exr_headers, num_headers,
                                           exr_version, &buf.at(0), err);
}